

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

void vera::splitFacesFromHorizontalCross<unsigned_char>
               (uchar *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<unsigned_char> **_faces)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  CubemapFace<unsigned_char> *__s;
  uchar *puVar6;
  int n;
  int offset;
  CubemapFace<unsigned_char> *face;
  int iFace;
  int jFace;
  int l;
  int i;
  int faceHeight;
  int faceWidth;
  CubemapFace<unsigned_char> **_faces_local;
  size_t _channels_local;
  size_t _height_local;
  size_t _width_local;
  uchar *_data_local;
  
  iVar3 = (int)(_width >> 2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = _height;
  iVar4 = SUB164(auVar1 / ZEXT816(3),0);
  for (jFace = 0; jFace < 6; jFace = jFace + 1) {
    __s = (CubemapFace<unsigned_char> *)operator_new(0x18);
    memset(__s,0,0x18);
    _faces[jFace] = __s;
    _faces[jFace]->id = jFace;
    puVar6 = (uchar *)operator_new__(_channels * (long)iVar3 * (long)iVar4);
    _faces[jFace]->data = puVar6;
    _faces[jFace]->width = iVar3;
    _faces[jFace]->height = iVar4;
    _faces[jFace]->currentOffset = 0;
  }
  for (iFace = 0; (ulong)(long)iFace < _height; iFace = iFace + 1) {
    iVar5 = (iFace - iFace % iVar4) / iVar4;
    for (face._0_4_ = 0; (int)face < 4; face._0_4_ = (int)face + 1) {
      _n = (CubemapFace<unsigned_char> *)0x0;
      iVar2 = (int)_channels;
      if (((int)face == 2) && (iVar5 == 1)) {
        _n = *_faces;
      }
      if (((int)face == 0) && (iVar5 == 1)) {
        _n = _faces[1];
      }
      if (((int)face == 1) && (iVar5 == 0)) {
        _n = _faces[2];
      }
      if (((int)face == 1) && (iVar5 == 2)) {
        _n = _faces[3];
      }
      if (((int)face == 1) && (iVar5 == 1)) {
        _n = _faces[4];
      }
      if (((int)face == 3) && (iVar5 == 1)) {
        _n = _faces[5];
      }
      if (_n != (CubemapFace<unsigned_char> *)0x0) {
        memcpy(_n->data + _n->currentOffset,
               _data + iVar2 * (iVar3 * (int)face + iFace * (int)_width),(long)(iVar3 * iVar2));
        _n->currentOffset = _n->currentOffset + iVar2 * iVar3;
      }
    }
  }
  return;
}

Assistant:

void splitFacesFromHorizontalCross(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width / 4;
    int faceHeight = _height / 3;

    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[_channels * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        int jFace = (l - (l % faceHeight)) / faceHeight;

        for (int iFace = 0; iFace < 4; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = _channels * (faceWidth * iFace + l * _width);

            //      0   1   2   3 i      
            //  2      -X 
            //  1  -Y  +Z  +Y  -Z     
            //  0      +X
            //  j
            //
            if (iFace == 2 && jFace == 1) face = _faces[0]; // POS_Y
            if (iFace == 0 && jFace == 1) face = _faces[1]; // NEG_Y
            if (iFace == 1 && jFace == 0) face = _faces[2]; // POS_X
            if (iFace == 1 && jFace == 2) face = _faces[3]; // NEG_X
            if (iFace == 1 && jFace == 1) face = _faces[4]; // POS_Z
            if (iFace == 3 && jFace == 1) face = _faces[5]; // NEG_Z

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * _channels;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (_channels * faceWidth);
            }
        }
    }
}